

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_request.c
# Opt level: O2

ngx_int_t ngx_http_alloc_large_header_buffer(ngx_http_request_t *r,ngx_uint_t request_line)

{
  u_char *__src;
  void *pvVar1;
  ngx_http_connection_t *pnVar2;
  ngx_buf_t *pnVar3;
  u_char **ppuVar4;
  ngx_buf_t *pnVar5;
  ngx_chain_t *pnVar6;
  u_char *puVar7;
  char *fmt;
  ngx_log_t *pnVar8;
  u_char *puVar9;
  long lVar10;
  bool bVar11;
  
  pnVar8 = r->connection->log;
  if ((pnVar8->log_level & 0x100) != 0) {
    ngx_log_error_core(8,pnVar8,0,"http alloc large header buffer");
  }
  if (request_line == 0) {
    ppuVar4 = &r->header_name_start;
    bVar11 = r->state == 0;
  }
  else {
    if (r->state == 0) {
      pnVar5 = r->header_in;
      pnVar5->pos = pnVar5->start;
      pnVar5->last = pnVar5->start;
      return 0;
    }
    ppuVar4 = &r->request_start;
    bVar11 = false;
  }
  __src = *ppuVar4;
  pvVar1 = r->srv_conf[ngx_http_core_module.ctx_index];
  if ((!bVar11) &&
     (*(ulong *)((long)pvVar1 + 0x60) <= (ulong)((long)r->header_in->pos - (long)__src))) {
    return -5;
  }
  pnVar2 = r->http_connection;
  pnVar6 = pnVar2->free;
  if (pnVar6 == (ngx_chain_t *)0x0) {
    if (*(long *)((long)pvVar1 + 0x58) <= pnVar2->nbusy) {
      return -5;
    }
    pnVar5 = ngx_create_temp_buf(r->connection->pool,*(size_t *)((long)pvVar1 + 0x60));
    if (pnVar5 == (ngx_buf_t *)0x0) {
      return -1;
    }
    pnVar6 = ngx_alloc_chain_link(r->connection->pool);
    if (pnVar6 == (ngx_chain_t *)0x0) {
      return -1;
    }
    pnVar6->buf = pnVar5;
    pnVar8 = r->connection->log;
    if ((pnVar8->log_level & 0x100) != 0) {
      puVar9 = pnVar5->pos;
      lVar10 = (long)pnVar5->end - (long)pnVar5->last;
      fmt = "http large header alloc: %p %uz";
      goto LAB_00140040;
    }
  }
  else {
    pnVar2->free = pnVar6->next;
    pnVar5 = pnVar6->buf;
    pnVar8 = r->connection->log;
    if ((pnVar8->log_level & 0x100) != 0) {
      puVar9 = pnVar5->pos;
      lVar10 = (long)pnVar5->end - (long)pnVar5->last;
      fmt = "http large header free: %p %uz";
LAB_00140040:
      ngx_log_error_core(8,pnVar8,0,fmt,puVar9,lVar10);
    }
  }
  pnVar6->next = pnVar2->busy;
  pnVar2->busy = pnVar6;
  pnVar2->nbusy = pnVar2->nbusy + 1;
  if (r->state != 0) {
    pnVar8 = r->connection->log;
    if ((pnVar8->log_level & 0x100) != 0) {
      ngx_log_error_core(8,pnVar8,0,"http large header copy: %uz",
                         (long)r->header_in->pos - (long)__src);
    }
    puVar9 = pnVar5->start;
    memcpy(puVar9,__src,(long)r->header_in->pos - (long)__src);
    pnVar3 = r->header_in;
    pnVar5->pos = puVar9 + ((long)pnVar3->pos - (long)__src);
    pnVar5->last = puVar9 + ((long)pnVar3->pos - (long)__src);
    if (request_line == 0) {
      r->header_name_start = puVar9;
      r->header_name_end = puVar9 + ((long)r->header_name_end - (long)__src);
      r->header_start = puVar9 + ((long)r->header_start - (long)__src);
      ppuVar4 = &r->header_end;
      puVar7 = r->header_end;
    }
    else {
      r->request_start = puVar9;
      if (r->request_end != (u_char *)0x0) {
        r->request_end = puVar9 + ((long)r->request_end - (long)__src);
      }
      r->method_end = puVar9 + ((long)r->method_end - (long)__src);
      r->uri_start = puVar9 + ((long)r->uri_start - (long)__src);
      r->uri_end = puVar9 + ((long)r->uri_end - (long)__src);
      if (r->schema_start != (u_char *)0x0) {
        r->schema_start = puVar9 + ((long)r->schema_start - (long)__src);
        r->schema_end = puVar9 + ((long)r->schema_end - (long)__src);
      }
      if (r->host_start != (u_char *)0x0) {
        r->host_start = puVar9 + ((long)r->host_start - (long)__src);
        if (r->host_end != (u_char *)0x0) {
          r->host_end = puVar9 + ((long)r->host_end - (long)__src);
        }
      }
      if (r->port_start != (u_char *)0x0) {
        r->port_start = puVar9 + ((long)r->port_start - (long)__src);
        r->port_end = puVar9 + ((long)r->port_end - (long)__src);
      }
      if (r->uri_ext != (u_char *)0x0) {
        r->uri_ext = puVar9 + ((long)r->uri_ext - (long)__src);
      }
      if (r->args_start != (u_char *)0x0) {
        r->args_start = puVar9 + ((long)r->args_start - (long)__src);
      }
      puVar7 = (r->http_protocol).data;
      if (puVar7 == (u_char *)0x0) goto LAB_001402e5;
      ppuVar4 = &(r->http_protocol).data;
    }
    *ppuVar4 = puVar9 + ((long)puVar7 - (long)__src);
  }
LAB_001402e5:
  r->header_in = pnVar5;
  return 0;
}

Assistant:

static ngx_int_t
ngx_http_alloc_large_header_buffer(ngx_http_request_t *r,
    ngx_uint_t request_line)
{
    u_char                    *old, *new;
    ngx_buf_t                 *b;
    ngx_chain_t               *cl;
    ngx_http_connection_t     *hc;
    ngx_http_core_srv_conf_t  *cscf;

    ngx_log_debug0(NGX_LOG_DEBUG_HTTP, r->connection->log, 0,
                   "http alloc large header buffer");

    if (request_line && r->state == 0) {

        /* the client fills up the buffer with "\r\n" */

        r->header_in->pos = r->header_in->start;
        r->header_in->last = r->header_in->start;

        return NGX_OK;
    }

    old = request_line ? r->request_start : r->header_name_start;

    cscf = ngx_http_get_module_srv_conf(r, ngx_http_core_module);

    if (r->state != 0
        && (size_t) (r->header_in->pos - old)
                                     >= cscf->large_client_header_buffers.size)
    {
        return NGX_DECLINED;
    }

    hc = r->http_connection;

    if (hc->free) {
        cl = hc->free;
        hc->free = cl->next;

        b = cl->buf;

        ngx_log_debug2(NGX_LOG_DEBUG_HTTP, r->connection->log, 0,
                       "http large header free: %p %uz",
                       b->pos, b->end - b->last);

    } else if (hc->nbusy < cscf->large_client_header_buffers.num) {

        b = ngx_create_temp_buf(r->connection->pool,
                                cscf->large_client_header_buffers.size);
        if (b == NULL) {
            return NGX_ERROR;
        }

        cl = ngx_alloc_chain_link(r->connection->pool);
        if (cl == NULL) {
            return NGX_ERROR;
        }

        cl->buf = b;

        ngx_log_debug2(NGX_LOG_DEBUG_HTTP, r->connection->log, 0,
                       "http large header alloc: %p %uz",
                       b->pos, b->end - b->last);

    } else {
        return NGX_DECLINED;
    }

    cl->next = hc->busy;
    hc->busy = cl;
    hc->nbusy++;

    if (r->state == 0) {
        /*
         * r->state == 0 means that a header line was parsed successfully
         * and we do not need to copy incomplete header line and
         * to relocate the parser header pointers
         */

        r->header_in = b;

        return NGX_OK;
    }

    ngx_log_debug1(NGX_LOG_DEBUG_HTTP, r->connection->log, 0,
                   "http large header copy: %uz", r->header_in->pos - old);

    new = b->start;

    ngx_memcpy(new, old, r->header_in->pos - old);

    b->pos = new + (r->header_in->pos - old);
    b->last = new + (r->header_in->pos - old);

    if (request_line) {
        r->request_start = new;

        if (r->request_end) {
            r->request_end = new + (r->request_end - old);
        }

        r->method_end = new + (r->method_end - old);

        r->uri_start = new + (r->uri_start - old);
        r->uri_end = new + (r->uri_end - old);

        if (r->schema_start) {
            r->schema_start = new + (r->schema_start - old);
            r->schema_end = new + (r->schema_end - old);
        }

        if (r->host_start) {
            r->host_start = new + (r->host_start - old);
            if (r->host_end) {
                r->host_end = new + (r->host_end - old);
            }
        }

        if (r->port_start) {
            r->port_start = new + (r->port_start - old);
            r->port_end = new + (r->port_end - old);
        }

        if (r->uri_ext) {
            r->uri_ext = new + (r->uri_ext - old);
        }

        if (r->args_start) {
            r->args_start = new + (r->args_start - old);
        }

        if (r->http_protocol.data) {
            r->http_protocol.data = new + (r->http_protocol.data - old);
        }

    } else {
        r->header_name_start = new;
        r->header_name_end = new + (r->header_name_end - old);
        r->header_start = new + (r->header_start - old);
        r->header_end = new + (r->header_end - old);
    }

    r->header_in = b;

    return NGX_OK;
}